

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

void __thiscall
Wasm::WasmBytecodeGenerator::YieldToBlock
          (WasmBytecodeGenerator *this,BlockInfo *blockInfo,PolymorphicEmitInfo polyExpr)

{
  IWasmByteCodeWriter *pIVar1;
  ulong uVar2;
  OpCodeAsmJs OVar3;
  EmitInfo EVar4;
  WasmCompilationException *this_00;
  anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1 aVar5;
  uint uVar6;
  ulong uVar7;
  uint32 index;
  bool bVar8;
  PolymorphicEmitInfo other;
  undefined1 auStack_68 [8];
  PolymorphicEmitInfo polyYieldInfo;
  undefined1 local_50 [8];
  PolymorphicEmitInfo polyExpr_local;
  
  aVar5 = polyExpr.field_1;
  uVar6 = polyExpr.count;
  if ((blockInfo->yieldInfo).count != 0) {
    if (uVar6 != 0) {
      if (uVar6 == 1) {
        polyExpr_local._4_4_ = polyExpr.field_1._4_4_;
        bVar8 = polyExpr_local._4_4_ == 8;
      }
      else {
        bVar8 = uVar6 != 0;
        if (bVar8) {
          if ((aVar5.infos)->type == Any) {
            return;
          }
          uVar2 = 1;
          do {
            uVar7 = uVar2;
            if (uVar6 == uVar7) break;
            uVar2 = uVar7 + 1;
          } while (aVar5.infos[uVar7].type != Any);
          bVar8 = uVar7 < uVar6;
        }
      }
      if (bVar8) {
        return;
      }
    }
    auStack_68._0_4_ = (blockInfo->yieldInfo).count;
    auStack_68._4_4_ = *(undefined4 *)&(blockInfo->yieldInfo).field_0x4;
    polyYieldInfo._0_8_ = (blockInfo->yieldInfo).field_1;
    other._4_4_ = 0;
    other.count = uVar6;
    other.field_1.infos = aVar5.infos;
    local_50._0_4_ = uVar6;
    polyExpr_local._0_8_ = aVar5;
    bVar8 = PolymorphicEmitInfo::IsEquivalent((PolymorphicEmitInfo *)auStack_68,other);
    if (!bVar8) {
      this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException(this_00,L"Invalid yield type");
      __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                  WasmCompilationException::~WasmCompilationException);
    }
    if ((this->isUnreachable == false) && (blockInfo->didYield = true, uVar6 != 0)) {
      index = 0;
      do {
        EVar4 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)local_50,index);
        polyExpr_local.field_1.singleInfo =
             PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)auStack_68,index);
        pIVar1 = this->m_writer;
        OVar3 = GetReturnOp(this,EVar4.type);
        (*pIVar1->_vptr_IWasmByteCodeWriter[0xf])
                  (pIVar1,(ulong)OVar3,polyExpr_local.field_1.infos,(ulong)EVar4 & 0xffffffff);
        index = index + 1;
      } while (uVar6 != index);
    }
  }
  return;
}

Assistant:

void WasmBytecodeGenerator::YieldToBlock(BlockInfo* blockInfo, PolymorphicEmitInfo polyExpr)
{
    if (blockInfo->HasYield() && !polyExpr.IsUnreachable())
    {
        PolymorphicEmitInfo polyYieldInfo = blockInfo->yieldInfo;

        if (!polyYieldInfo.IsEquivalent(polyExpr))
        {
            throw WasmCompilationException(_u("Invalid yield type"));
        }

        if (!IsUnreachable())
        {
            blockInfo->didYield = true;
            for (uint32 i = 0; i < polyExpr.Count(); ++i)
            {
                EmitInfo expr = polyExpr.GetInfo(i);
                EmitInfo yieldInfo = polyYieldInfo.GetInfo(i);
                m_writer->AsmReg2(GetReturnOp(expr.type), yieldInfo.location, expr.location);
            }
        }
    }
}